

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::SliderFloatN(char *label,float *v,int components,float v_min,float v_max,
                        char *display_format,float power)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  char *text_end;
  int local_58;
  int i;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  float power_local;
  char *display_format_local;
  float v_max_local;
  float v_min_local;
  int components_local;
  float *v_local;
  char *label_local;
  
  pIVar3 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar3->SkipItems & 1U) == 0) {
    label_local._7_1_ = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components,0.0);
    for (local_58 = 0; local_58 < components; local_58 = local_58 + 1) {
      PushID(local_58);
      bVar2 = SliderFloat("##v",v + local_58,v_min,v_max,display_format,power);
      label_local._7_1_ = label_local._7_1_ != false || bVar2;
      SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
      PopID();
      PopItemWidth();
    }
    PopID();
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextUnformatted(label,text_end);
    EndGroup();
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::SliderFloatN(const char* label, float* v, int components, float v_min, float v_max, const char* display_format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= SliderFloat("##v", &v[i], v_min, v_max, display_format, power);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
    }
    PopID();

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();

    return value_changed;
}